

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

int greedycmp(void *ax,void *ay)

{
  long lVar1;
  long lVar2;
  int iVar3;
  
  lVar1 = *ax;
  lVar2 = *ay;
  if (*(ulong *)(lVar1 + 0x98) < *(ulong *)(lVar2 + 0x98)) {
    return -1;
  }
  iVar3 = 1;
  if (*(ulong *)(lVar1 + 0x98) <= *(ulong *)(lVar2 + 0x98)) {
    if (*(int *)(lVar1 + 0x90) < *(int *)(lVar2 + 0x90)) {
      return -1;
    }
    if (*(int *)(lVar1 + 0x90) <= *(int *)(lVar2 + 0x90)) {
      iVar3 = -1;
      if (*(ulong *)(lVar2 + 0xb8) <= *(ulong *)(lVar1 + 0xb8)) {
        return (int)(*(ulong *)(lVar2 + 0xb8) < *(ulong *)(lVar1 + 0xb8));
      }
    }
  }
  return iVar3;
}

Assistant:

static int greedycmp(const void *ax, const void *ay) {
  PNode *x = *(PNode **)ax;
  PNode *y = *(PNode **)ay;
  /* first by earliest start */
  if (x->parse_node.start_loc.s < y->parse_node.start_loc.s) return -1;
  if (x->parse_node.start_loc.s > y->parse_node.start_loc.s) return 1;
  /* second by symbol */
  if (x->parse_node.symbol < y->parse_node.symbol) return -1;
  if (x->parse_node.symbol > y->parse_node.symbol) return 1;
  /* third by length */
  if (x->parse_node.end < y->parse_node.end) return -1;
  if (x->parse_node.end > y->parse_node.end) return 1;
  return 0;
}